

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mod2dense.c
# Opt level: O2

int mod2dense_equal(mod2dense *m1,mod2dense *m2)

{
  mod2word **ppmVar1;
  mod2word **ppmVar2;
  mod2word *pmVar3;
  mod2word *pmVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  
  if ((m1->n_rows == m2->n_rows) && (uVar5 = m1->n_cols, uVar5 == m2->n_cols)) {
    uVar8 = m1->n_words - 1;
    uVar6 = 0;
    if ((int)uVar8 < 1) {
      uVar8 = 0;
    }
    uVar9 = (ulong)uVar8;
    if ((int)uVar5 < 1) {
      uVar5 = 0;
    }
    do {
      if (uVar6 == uVar5) {
        return 1;
      }
      ppmVar1 = m1->col + uVar6;
      ppmVar2 = m2->col + uVar6;
      uVar7 = 0;
      while (uVar9 != uVar7) {
        pmVar3 = *ppmVar1 + uVar7;
        pmVar4 = *ppmVar2 + uVar7;
        uVar7 = uVar7 + 1;
        if (*pmVar3 != *pmVar4) {
          return 0;
        }
      }
      uVar6 = uVar6 + 1;
    } while ((((*ppmVar2)[uVar9] ^ (*ppmVar1)[uVar9]) & ~(-1 << ((byte)m1->n_rows & 0x1f))) == 0);
    return 0;
  }
  fwrite("mod2dense_equal: Matrices have different dimensions\n",0x34,1,_stderr);
  exit(1);
}

Assistant:

int mod2dense_equal
( mod2dense *m1,
  mod2dense *m2
)
{
  int k, j, w;
  mod2word m;

  if (mod2dense_rows(m1)!=mod2dense_rows(m2) 
   || mod2dense_cols(m1)!=mod2dense_cols(m2))
  { fprintf(stderr,"mod2dense_equal: Matrices have different dimensions\n");
    exit(1);
  }

  w = m1->n_words;

  /* Form a mask that has 1s in the lower bit positions corresponding to
     bits that contain information in the last word of a matrix column. */

  m = (1 << (mod2_wordsize - (w*mod2_wordsize-m1->n_rows))) - 1;
  
  for (j = 0; j<mod2dense_cols(m1); j++)
  {
    for (k = 0; k<w-1; k++)
    { if (m1->col[j][k] != m2->col[j][k]) return 0;
    }

    if ((m1->col[j][k]&m) != (m2->col[j][k]&m)) return 0;
  }

  return 1;
}